

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void sha2_224_64(void *key,int len,uint32_t seed,void *out)

{
  uchar buf [28];
  undefined8 local_48 [4];
  
  sha224_init(&ltc_state);
  ltc_state.sha256.state[0] = seed ^ 0xc1059ed8;
  sha256_process(&ltc_state,(uchar *)key,(long)len);
  sha224_done(&ltc_state,(uchar *)local_48);
  *(undefined8 *)out = local_48[0];
  return;
}

Assistant:

inline void sha2_224_64(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[28];
  sha224_init(&ltc_state);
  ltc_state.sha256.state[0] = 0xc1059ed8UL ^ seed;
  sha224_process(&ltc_state, (unsigned char *)key, len);
  sha224_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}